

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

bool S2Loop::HasCrossingRelation(S2Loop *a,S2Loop *b,LoopRelation *relation)

{
  int iVar1;
  S2ClippedShape *a_clipped;
  S2ClippedShape *b_clipped;
  RangeIterator_conflict *target;
  RangeIterator_conflict *this;
  bool bVar2;
  bool bVar3;
  RangeIterator_conflict bi;
  RangeIterator_conflict ai;
  LoopCrosser ab;
  LoopCrosser ba;
  
  RangeIterator::RangeIterator((RangeIterator *)&ai,&a->index_);
  RangeIterator::RangeIterator((RangeIterator *)&bi,&b->index_);
  LoopCrosser::LoopCrosser(&ab,a,b,relation,false);
  LoopCrosser::LoopCrosser(&ba,b,a,relation,true);
LAB_0023cbd8:
  do {
    while( true ) {
      bVar2 = (ai.it_.super_IteratorBase.id_.id_ & bi.it_.super_IteratorBase.id_.id_) ==
              0xffffffffffffffff;
      if (bVar2) goto LAB_0023cce7;
      target = &bi;
      this = &ai;
      if ((bi.range_min_.id_ <= ai.range_max_.id_) &&
         (target = &ai, this = &bi, ai.range_min_.id_ <= bi.range_max_.id_)) break;
      RangeIterator::SeekTo((RangeIterator *)this,target);
    }
    bVar3 = (long)((-ai.it_.super_IteratorBase.id_.id_ & ai.it_.super_IteratorBase.id_.id_) -
                  (-bi.it_.super_IteratorBase.id_.id_ & bi.it_.super_IteratorBase.id_.id_)) < 0;
    if ((-ai.it_.super_IteratorBase.id_.id_ & ai.it_.super_IteratorBase.id_.id_) ==
        (-bi.it_.super_IteratorBase.id_.id_ & bi.it_.super_IteratorBase.id_.id_) || bVar3) {
      if (!bVar3) {
        bVar3 = RangeIterator::contains_center((RangeIterator *)&ai);
        if ((ab.a_crossing_target_ == (uint)bVar3) &&
           (bVar3 = RangeIterator::contains_center((RangeIterator *)&bi),
           ab.b_crossing_target_ == (uint)bVar3)) goto LAB_0023cce7;
        iVar1 = RangeIterator::num_edges((RangeIterator *)&ai);
        if ((0 < iVar1) && (iVar1 = RangeIterator::num_edges((RangeIterator *)&bi), 0 < iVar1)) {
          a_clipped = RangeIterator::clipped((RangeIterator *)&ai);
          b_clipped = RangeIterator::clipped((RangeIterator *)&bi);
          bVar3 = LoopCrosser::CellCrossesCell(&ab,a_clipped,b_clipped);
          if (bVar3) goto LAB_0023cce7;
        }
        RangeIterator::Next((RangeIterator *)&ai);
        RangeIterator::Next((RangeIterator *)&bi);
        goto LAB_0023cbd8;
      }
      bVar3 = LoopCrosser::HasCrossingRelation(&ba,&bi,&ai);
    }
    else {
      bVar3 = LoopCrosser::HasCrossingRelation(&ab,&ai,&bi);
    }
    if (bVar3 != false) {
LAB_0023cce7:
      LoopCrosser::~LoopCrosser(&ba);
      LoopCrosser::~LoopCrosser(&ab);
      return !bVar2;
    }
  } while( true );
}

Assistant:

bool S2Loop::HasCrossingRelation(const S2Loop& a, const S2Loop& b,
                                            LoopRelation* relation) {
  // We look for S2CellId ranges where the indexes of A and B overlap, and
  // then test those edges for crossings.
  RangeIterator ai(&a.index_), bi(&b.index_);
  LoopCrosser ab(a, b, relation, false);  // Tests edges of A against B
  LoopCrosser ba(b, a, relation, true);   // Tests edges of B against A
  while (!ai.Done() || !bi.Done()) {
    if (ai.range_max() < bi.range_min()) {
      // The A and B cells don't overlap, and A precedes B.
      ai.SeekTo(bi);
    } else if (bi.range_max() < ai.range_min()) {
      // The A and B cells don't overlap, and B precedes A.
      bi.SeekTo(ai);
    } else {
      // One cell contains the other.  Determine which cell is larger.
      int64 ab_relation = ai.id().lsb() - bi.id().lsb();
      if (ab_relation > 0) {
        // A's index cell is larger.
        if (ab.HasCrossingRelation(&ai, &bi)) return true;
      } else if (ab_relation < 0) {
        // B's index cell is larger.
        if (ba.HasCrossingRelation(&bi, &ai)) return true;
      } else {
        // The A and B cells are the same.  Since the two cells have the same
        // center point P, check whether P satisfies the crossing targets.
        if (ai.contains_center() == ab.a_crossing_target() &&
            bi.contains_center() == ab.b_crossing_target()) {
          return true;
        }
        // Otherwise test all the edge crossings directly.
        if (ai.num_edges() > 0 && bi.num_edges() > 0 &&
            ab.CellCrossesCell(ai.clipped(), bi.clipped())) {
          return true;
        }
        ai.Next();
        bi.Next();
      }
    }
  }
  return false;
}